

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::JsRTCodeParseAction_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  uint uVar1;
  byte *script_00;
  bool bVar2;
  ScriptContext *this;
  JsRTCodeParseAction *pJVar3;
  JavascriptFunction *this_00;
  ParseableFunctionInfo *pfi;
  FunctionBody *body;
  Utf8SourceInfo *this_01;
  ThreadContext *pTVar4;
  void *unaff_retaddr;
  undefined1 local_170 [8];
  EnterScriptObject __enterScriptObject;
  ScriptEntryExitRecord __entryExitRecord;
  ScriptContext *__localScriptContext;
  FunctionBody *fb;
  undefined1 local_e8 [8];
  CompileScriptException se;
  Utf8SourceInfo *utf8SourceInfo;
  SRCINFO si;
  int chsize;
  uint32 srcUriLength;
  char16 *srcUri;
  SourceContextInfo *sourceContextInfo;
  uint32 scriptByteLength;
  byte *script;
  JavascriptFunction *function;
  JsRTCodeParseAction *cpAction;
  ScriptContext *ctx;
  ThreadContextTTD *executeContext_local;
  EventLogEntry *evt_local;
  
  this = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (this == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  pJVar3 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTCodeParseAction,(TTD::NSLogEvents::EventKind)67>
                     (evt);
  script_00 = pJVar3->SourceCode;
  uVar1 = pJVar3->SourceByteLength;
  if ((bool)(pJVar3->IsUtf8 & 1U) ==
      ((pJVar3->LoadFlag & LoadScriptFlag_Utf8Source) == LoadScriptFlag_Utf8Source)) {
    srcUri = (char16 *)
             Js::ScriptContext::GetSourceContextInfo
                       (this,pJVar3->SourceContextId,(SimpleDataCacheWrapper *)0x0);
    if ((SourceContextInfo *)srcUri == (SourceContextInfo *)0x0) {
      si.grfsi = (pJVar3->SourceUri).Length;
      srcUri = (char16 *)
               Js::ScriptContext::CreateSourceContextInfo
                         (this,pJVar3->SourceContextId,(pJVar3->SourceUri).Contents,(ulong)si.grfsi,
                          (SimpleDataCacheWrapper *)0x0,(char16 *)0x0,0);
    }
    si.moduleID = 2 - ((pJVar3->LoadFlag & LoadScriptFlag_Utf8Source) >> 6);
    SRCINFO::SRCINFO((SRCINFO *)&utf8SourceInfo,(SourceContextInfo *)srcUri,0,0,0,0,
                     uVar1 / si.moduleID,0,0,0);
    se.bstrLine = (BSTR)0x0;
    CompileScriptException::CompileScriptException((CompileScriptException *)local_e8);
    this_00 = Js::ScriptContext::LoadScript
                        (this,script_00,(ulong)uVar1,(SRCINFO *)&utf8SourceInfo,
                         (CompileScriptException *)local_e8,(Utf8SourceInfo **)&se.bstrLine,
                         L"Global code",pJVar3->LoadFlag,(Var)0x0);
    if (this_00 != (JavascriptFunction *)0x0) {
      pfi = Js::JavascriptFunction::GetParseableFunctionInfo(this_00);
      body = JsSupport::ForceAndGetFunctionBody(pfi);
      __enterScriptObject.library = (JavascriptLibrary *)0x0;
      Js::EnterScriptObject::EnterScriptObject
                ((EnterScriptObject *)local_170,this,
                 (ScriptEntryExitRecord *)&__enterScriptObject.library,unaff_retaddr,
                 &stack0x00000000,true,false,false);
      Js::ScriptContext::OnScriptStart(this,false,true);
      Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_170);
      ScriptContextTTD::ProcessFunctionBodyOnLoad(this->TTDContextInfo,body,(FunctionBody *)0x0);
      ScriptContextTTD::RegisterLoadedScript(this->TTDContextInfo,body,pJVar3->BodyCtrId);
      this_01 = Js::FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)body);
      Js::Utf8SourceInfo::SetSourceInfoForDebugReplay_TTD(this_01,pJVar3->BodyCtrId);
      Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_170);
      bVar2 = Js::ScriptContext::ShouldPerformReplayDebuggerAction(this);
      if (bVar2) {
        pTVar4 = Js::ScriptContext::GetThreadContext(this);
        ExecutionInfoManager::ProcessScriptLoad
                  (pTVar4->TTDExecutionInfo,this,pJVar3->BodyCtrId,body,
                   (Utf8SourceInfo *)se.bstrLine,(CompileScriptException *)local_e8);
      }
      JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTCodeParseAction,(TTD::NSLogEvents::EventKind)67>
                (executeContext,evt,this_00);
      CompileScriptException::~CompileScriptException((CompileScriptException *)local_e8);
      return;
    }
    TTDAbort_unrecoverable_error("Something went wrong");
  }
  TTDAbort_unrecoverable_error("Utf8 status is inconsistent!!!");
}

Assistant:

void JsRTCodeParseAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTCodeParseAction* cpAction = GetInlineEventDataAs<JsRTCodeParseAction, EventKind::CodeParseActionTag>(evt);

            Js::JavascriptFunction* function = nullptr;

            byte* script = cpAction->SourceCode;
            uint32 scriptByteLength = cpAction->SourceByteLength;

            TTDAssert(cpAction->IsUtf8 == ((cpAction->LoadFlag & LoadScriptFlag_Utf8Source) == LoadScriptFlag_Utf8Source), "Utf8 status is inconsistent!!!");

            SourceContextInfo * sourceContextInfo = ctx->GetSourceContextInfo((DWORD_PTR)cpAction->SourceContextId, nullptr);

            if(sourceContextInfo == nullptr)
            {
                const char16* srcUri = cpAction->SourceUri.Contents;
                uint32 srcUriLength = cpAction->SourceUri.Length;

                sourceContextInfo = ctx->CreateSourceContextInfo((DWORD_PTR)cpAction->SourceContextId, srcUri, srcUriLength, nullptr);
            }

            TTDAssert(cpAction->IsUtf8 || sizeof(wchar) == sizeof(char16), "Non-utf8 code only allowed on windows!!!");
            const int chsize = (cpAction->LoadFlag & LoadScriptFlag_Utf8Source) ? sizeof(char) : sizeof(char16);
            SRCINFO si = {
                /* sourceContextInfo   */ sourceContextInfo,
                /* dlnHost             */ 0,
                /* ulColumnHost        */ 0,
                /* lnMinHost           */ 0,
                /* ichMinHost          */ 0,
                /* ichLimHost          */ static_cast<ULONG>(scriptByteLength / chsize), // OK to truncate since this is used to limit sourceText in debugDocument/compilation errors.
                /* ulCharOffset        */ 0,
                /* mod                 */ kmodGlobal,
                /* grfsi               */ 0
            };

            Js::Utf8SourceInfo* utf8SourceInfo = nullptr;
            CompileScriptException se;
            function = ctx->LoadScript(script, scriptByteLength, &si, &se,
                &utf8SourceInfo, Js::Constants::GlobalCode, cpAction->LoadFlag, nullptr);

            TTDAssert(function != nullptr, "Something went wrong");

            Js::FunctionBody* fb = TTD::JsSupport::ForceAndGetFunctionBody(function->GetParseableFunctionInfo());

            ////
            //We don't do this automatically in the eval helper so do it here
            BEGIN_JS_RUNTIME_CALL(ctx);
            {
                ctx->TTDContextInfo->ProcessFunctionBodyOnLoad(fb, nullptr);
                ctx->TTDContextInfo->RegisterLoadedScript(fb, cpAction->BodyCtrId);

                fb->GetUtf8SourceInfo()->SetSourceInfoForDebugReplay_TTD(cpAction->BodyCtrId);
            }
            END_JS_RUNTIME_CALL(ctx);

            if(ctx->ShouldPerformReplayDebuggerAction())
            {
                ctx->GetThreadContext()->TTDExecutionInfo->ProcessScriptLoad(ctx, cpAction->BodyCtrId, fb, utf8SourceInfo, &se);
            }
            ////

            JsRTActionHandleResultForReplay<JsRTCodeParseAction, EventKind::CodeParseActionTag>(executeContext, evt, (Js::Var)function);
        }